

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O2

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::Walk
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNode *pnode,Context context)

{
  OpCode OVar1;
  code *pcVar2;
  ResultType RVar3;
  undefined1 uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ParseNodeExportDefault *pPVar8;
  ParseNodeForInOrForOf *pnode_00;
  ParseNodeUni *pPVar9;
  ParseNodeCall *pPVar10;
  undefined4 *puVar11;
  ParseNodeSwitch *pPVar12;
  ParseNodeProg *pPVar13;
  ParseNodeTri *pPVar14;
  ParseNodeClass *pPVar15;
  ParseNodeBlock *pPVar16;
  ParseNodeIf *pPVar17;
  ParseNodeFnc *pPVar18;
  ParseNodePtr *ppPVar19;
  ParseNodeParamPattern *pPVar20;
  ParseNodeVar *pPVar21;
  ParseNodeStrTemplate *pPVar22;
  ParseNodeReturn *pPVar23;
  ParseNodeWhile *pPVar24;
  ParseNodeFor *pPVar25;
  ParseNodeCatch *pPVar26;
  _func_int *UNRECOVERED_JUMPTABLE;
  ParseNodeBin *pPVar27;
  Context in_RCX;
  ParseNode *pPVar28;
  ParseNodeTry *pPVar29;
  ParseNodeCase **ppPVar30;
  ParseNode *local_40;
  ParseNodeWalker<WalkerPolicyTest> *local_38;
  
  uVar4 = 1;
LAB_0077c955:
  if (pnode == (ParseNode *)0x0) {
    return true;
  }
  OVar1 = pnode->nop;
  switch(OVar1) {
  case knopCall:
  case knopNew:
    pPVar10 = ParseNode::AsParseNodeCall(pnode);
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar10->pnodeTarget,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    pPVar28 = (ParseNode *)&pPVar10->pnodeArgs;
    break;
  case knopDot:
  case knopAsg:
  case knopInstOf:
  case knopIn:
  case knopEqv:
  case knopNEqv:
  case knopComma:
  case knopLogOr:
  case knopLogAnd:
  case knopCoalesce:
  case knopLsh:
  case knopRsh:
  case knopRs2:
  case knopIndex:
  case knopAsgAdd:
  case knopAsgSub:
  case knopAsgMul:
  case knopAsgDiv:
  case knopAsgExpo:
  case knopAsgMod:
  case knopAsgAnd:
  case knopAsgXor:
  case knopAsgOr:
  case knopAsgLsh:
  case knopAsgRsh:
  case knopAsgRs2:
  case knopMember:
  case knopMemberShort:
  case knopSetMember:
  case knopGetMember:
  case knopModule:
  case knopEndCode:
  case knopDebugger:
  case knopBreak:
  case knopContinue:
  case knopObjectPattern:
  case knopObjectPatternMember:
  case knopArrayPattern:
  case knopParamPattern:
    goto switchD_0077c972_caseD_30;
  case knopQmark:
    pPVar14 = ParseNode::AsParseNodeTri(pnode);
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar14->pnode1,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar14->pnode2,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    pPVar16 = (ParseNodeBlock *)pPVar14->pnode3;
    UNRECOVERED_JUMPTABLE =
         *(this->super_WalkerPolicyTest).
          super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>._vptr_WalkerPolicyBase;
    goto LAB_0077cf88;
  case knopList:
    local_40 = pnode;
    RVar3 = WalkList(this,(ParseNode *)&local_40,(ParseNode **)context,in_RCX);
    return RVar3;
  case knopVarDecl:
  case knopConstDecl:
  case knopLetDecl:
  case knopTemp:
    pPVar21 = ParseNode::AsParseNodeVar(pnode);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    pPVar16 = (ParseNodeBlock *)pPVar21->pnodeInit;
    goto LAB_0077ceb9;
  case knopFncDecl:
    local_40 = pnode;
    local_38 = this;
    pPVar18 = ParseNode::AsParseNodeFnc(pnode);
    ppPVar19 = &pPVar18->pnodeParams;
    while (pPVar28 = *ppPVar19, pPVar28 != (ParseNode *)0x0) {
      iVar7 = (**(local_38->super_WalkerPolicyTest).
                 super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                 _vptr_WalkerPolicyBase)(local_38,pPVar28,context);
      bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (!bVar5) {
        return (ResultType)(char)iVar7;
      }
      if (pPVar28->nop == knopParamPattern) {
        pPVar20 = ParseNode::AsParseNodeParamPattern(pPVar28);
        ppPVar19 = &pPVar20->pnodeNext;
      }
      else {
        pPVar21 = ParseNode::AsParseNodeVar(pPVar28);
        ppPVar19 = &pPVar21->pnodeNext;
      }
    }
    if (pPVar18->pnodeRest != (ParseNodePtr)0x0) {
      iVar7 = (**(local_38->super_WalkerPolicyTest).
                 super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                 _vptr_WalkerPolicyBase)(local_38,pPVar18->pnodeRest,context);
      bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (!bVar5) {
        return (ResultType)(char)iVar7;
      }
    }
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    pPVar16 = (ParseNodeBlock *)pPVar18->pnodeBody;
    UNRECOVERED_JUMPTABLE =
         *(local_38->super_WalkerPolicyTest).
          super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>._vptr_WalkerPolicyBase;
    this = local_38;
LAB_0077cf88:
    iVar7 = (*UNRECOVERED_JUMPTABLE)(this,pPVar16,context);
    return SUB41(iVar7,0);
  case knopClassDecl:
    pPVar15 = ParseNode::AsParseNodeClass(pnode);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar15->pnodeExtends,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar15->pnodeConstructor,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    pPVar28 = (ParseNode *)&pPVar15->pnodeMembers;
    break;
  case knopProg:
    pPVar13 = ParseNode::AsParseNodeProg(pnode);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    pPVar28 = (ParseNode *)&(pPVar13->super_ParseNodeFnc).pnodeBody;
    break;
  case knopFor:
    pPVar25 = ParseNode::AsParseNodeFor(pnode);
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar25->pnodeInit,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar25->pnodeCond,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    pPVar29 = (ParseNodeTry *)pPVar25->pnodeIncr;
    goto LAB_0077cefd;
  case knopIf:
    pPVar17 = ParseNode::AsParseNodeIf(pnode);
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar17->pnodeCond,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar17->pnodeTrue,context);
    uVar4 = (undefined1)iVar7;
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)uVar4;
    }
    pPVar16 = (ParseNodeBlock *)pPVar17->pnodeFalse;
    goto LAB_0077ceb9;
  case knopWhile:
    pPVar25 = (ParseNodeFor *)ParseNode::AsParseNodeWhile(pnode);
    goto LAB_0077cef6;
  case knopDoWhile:
    pPVar24 = ParseNode::AsParseNodeWhile(pnode);
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar24->pnodeBody,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    goto LAB_0077ced2;
  case knopForIn:
  case knopForOf:
  case knopForAwaitOf:
    pnode_00 = ParseNode::AsParseNodeForInOrForOf(pnode);
    RVar3 = WalkForInOrForOf(this,pnode_00,context);
    return RVar3;
  case knopBlock:
    pPVar16 = ParseNode::AsParseNodeBlock(pnode);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    if (pPVar16->pnodeStmt == (ParseNodePtr)0x0) {
      return true;
    }
    pPVar28 = (ParseNode *)&pPVar16->pnodeStmt;
    break;
  case knopStrTemplate:
    pPVar22 = ParseNode::AsParseNodeStrTemplate(pnode);
    if ((pPVar22->field_0x2a & 1) == 0) {
      if (pPVar22->pnodeSubstitutionExpressions == (ParseNodePtr)0x0) {
        return true;
      }
      RVar3 = WalkList(this,(ParseNode *)&pPVar22->pnodeSubstitutionExpressions,
                       (ParseNode **)context,in_RCX);
      bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (!bVar5) {
        return RVar3;
      }
    }
    pPVar28 = (ParseNode *)&pPVar22->pnodeStringLiterals;
    break;
  case knopWith:
    pPVar25 = (ParseNodeFor *)ParseNode::AsParseNodeWith(pnode);
    goto LAB_0077cef6;
  case knopSwitch:
    pPVar12 = ParseNode::AsParseNodeSwitch(pnode);
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar12->pnodeVal,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    ppPVar30 = &pPVar12->pnodeCases;
    while( true ) {
      if (*ppPVar30 == (ParseNodeCase *)0x0) {
        return true;
      }
      iVar7 = (**(this->super_WalkerPolicyTest).
                 super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                 _vptr_WalkerPolicyBase)(this,*ppPVar30,context);
      bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (!bVar5) break;
      ppPVar30 = &(*ppPVar30)->pnodeNext;
    }
    return (ResultType)(char)iVar7;
  case knopCase:
    pPVar26 = (ParseNodeCatch *)ParseNode::AsParseNodeCase(pnode);
    goto LAB_0077cf3e;
  case knopTryCatch:
    pPVar25 = (ParseNodeFor *)ParseNode::AsParseNodeTryCatch(pnode);
    goto LAB_0077cef6;
  case knopCatch:
    pPVar26 = ParseNode::AsParseNodeCatch(pnode);
LAB_0077cf3e:
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar26->pnodeParam,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    pPVar16 = (ParseNodeBlock *)pPVar26->pnodeBody;
    goto LAB_0077cf7c;
  case knopReturn:
    pPVar23 = ParseNode::AsParseNodeReturn(pnode);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    pPVar16 = (ParseNodeBlock *)pPVar23->pnodeExpr;
LAB_0077ceb9:
    if (pPVar16 == (ParseNodeBlock *)0x0) {
      return (ResultType)uVar4;
    }
    goto LAB_0077cf7c;
  case knopTry:
    pPVar24 = (ParseNodeWhile *)ParseNode::AsParseNodeTry(pnode);
    goto LAB_0077ced2;
  case knopThrow:
switchD_0077c972_caseD_6d:
    pPVar9 = ParseNode::AsParseNodeUni(pnode);
    RVar3 = WalkPostUnary(this,pPVar9,context);
    return RVar3;
  case knopFinally:
    pPVar24 = (ParseNodeWhile *)ParseNode::AsParseNodeFinally(pnode);
LAB_0077ced2:
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    pPVar16 = (ParseNodeBlock *)pPVar24->pnodeCond;
    goto LAB_0077cf7c;
  case knopTryFinally:
    pPVar25 = (ParseNodeFor *)ParseNode::AsParseNodeTryFinally(pnode);
LAB_0077cef6:
    pPVar29 = (ParseNodeTry *)pPVar25->pnodeCond;
LAB_0077cefd:
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar29,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    pPVar16 = (ParseNodeBlock *)pPVar25->pnodeBody;
LAB_0077cf7c:
    UNRECOVERED_JUMPTABLE =
         *(this->super_WalkerPolicyTest).
          super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>._vptr_WalkerPolicyBase;
    goto LAB_0077cf88;
  case knopExportDefault:
    goto switchD_0077c972_caseD_74;
  default:
    if (OVar1 - 0x12 < 2) goto switchD_0077c972_caseD_6d;
switchD_0077c972_caseD_30:
    uVar6 = ParseNode::Grfnop((uint)OVar1);
    if ((uVar6 & 2) != 0) {
      return true;
    }
    if ((uVar6 & 8) == 0) {
      if ((uVar6 & 4) == 0) {
        if ((uVar6 >> 10 & 1) != 0) {
          return true;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        Js::Throw::ReportAssert
                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/pnodewalk.h"
                   ,0x234,"(false)","false");
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      pPVar9 = ParseNode::AsParseNodeUni(pnode);
      bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (!bVar5) {
        return true;
      }
      pPVar16 = (ParseNodeBlock *)pPVar9->pnode1;
      goto LAB_0077ceb9;
    }
    pPVar27 = ParseNode::AsParseNodeBin(pnode);
    iVar7 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pPVar27->pnode1,context);
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return (ResultType)(char)iVar7;
    }
    bVar5 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar5) {
      return true;
    }
    pPVar16 = (ParseNodeBlock *)pPVar27->pnode2;
    goto LAB_0077cf7c;
  }
  RVar3 = WalkList(this,pPVar28,(ParseNode **)context,in_RCX);
  return RVar3;
switchD_0077c972_caseD_74:
  pPVar8 = ParseNode::AsParseNodeExportDefault(pnode);
  pnode = pPVar8->pnodeExpr;
  goto LAB_0077c955;
}

Assistant:

ResultType Walk(ParseNode *pnode, Context context)
    {
        if (!pnode) return DefaultResult();

        switch (pnode->nop) {
        // Handle all special cases first.

        // Post-fix unary operators.
        //PTNODE(knopIncPost    , "++ post"    ,Inc     ,Uni  ,fnopUni|fnopAsg)
        //PTNODE(knopDecPost    , "-- post"    ,Dec     ,Uni  ,fnopUni|fnopAsg)
        case knopIncPost:
        case knopDecPost:
            return WalkPostUnary(pnode->AsParseNodeUni(), context);

        // Call and call like
        //PTNODE(knopCall       , "()"        ,None    ,Bin  ,fnopBin)
        //PTNODE(knopNew        , "new"        ,None    ,Bin  ,fnopBin)
        case knopCall:
        case knopNew:
            return WalkCall(pnode->AsParseNodeCall(), context);

        // Ternary operator
        //PTNODE(knopQmark      , "?"            ,None    ,Tri  ,fnopBin)
        case knopQmark:
            return WalkTernary(pnode->AsParseNodeTri(), context);

        // General nodes.
        //PTNODE(knopList       , "<list>"    ,None    ,Bin  ,fnopNone)
        case knopList:
            return WalkList(NULL, pnode, context);

        //PTNODE(knopVarDecl    , "varDcl"    ,None    ,Var  ,fnopNone)
        case knopVarDecl:
        case knopConstDecl:
        case knopLetDecl:
        case knopTemp:
            return WalkVar(pnode->AsParseNodeVar(), context);

        //PTNODE(knopFncDecl    , "fncDcl"    ,None    ,Fnc  ,fnopLeaf)
        case knopFncDecl:
            return WalkFnc(pnode->AsParseNodeFnc(), context);

        //PTNODE(knopProg       , "program"    ,None    ,Fnc  ,fnopNone)
        case knopProg:
            return WalkProg(pnode->AsParseNodeProg(), context);

        //PTNODE(knopFor        , "for"        ,None    ,For  ,fnopBreak|fnopContinue)
        case knopFor:
            return WalkFor(pnode->AsParseNodeFor(), context);

        //PTNODE(knopIf         , "if"        ,None    ,If   ,fnopNone)
        case knopIf:
            return WalkIf(pnode->AsParseNodeIf(), context);

        //PTNODE(knopWhile      , "while"        ,None    ,While,fnopBreak|fnopContinue)
        case knopWhile:
            return WalkWhile(pnode->AsParseNodeWhile(), context);

         //PTNODE(knopDoWhile    , "do-while"    ,None    ,While,fnopBreak|fnopContinue)
        case knopDoWhile:
            return WalkDoWhile(pnode->AsParseNodeWhile(), context);

        //PTNODE(knopForIn      , "for in"    ,None    ,ForIn,fnopBreak|fnopContinue|fnopCleanup)
        case knopForIn:
            return WalkForInOrForOf(pnode->AsParseNodeForInOrForOf(), context);

        case knopForOf:
            return WalkForInOrForOf(pnode->AsParseNodeForInOrForOf(), context);

        case knopForAwaitOf:
            return WalkForInOrForOf(pnode->AsParseNodeForInOrForOf(), context);

        //PTNODE(knopReturn     , "return"    ,None    ,Uni  ,fnopNone)
        case knopReturn:
            return WalkReturn(pnode->AsParseNodeReturn(), context);

        //PTNODE(knopBlock      , "{}"        ,None    ,Block,fnopNone)
        case knopBlock:
            return WalkBlock(pnode->AsParseNodeBlock(), context);

        //PTNODE(knopWith       , "with"        ,None    ,With ,fnopCleanup)
        case knopWith:
            return WalkWith(pnode->AsParseNodeWith(), context);

        //PTNODE(knopSwitch     , "switch"    ,None    ,Switch,fnopBreak)
        case knopSwitch:
            return WalkSwitch(pnode->AsParseNodeSwitch(), context);

        //PTNODE(knopCase       , "case"        ,None    ,Case ,fnopNone)
        case knopCase:
            return WalkCase(pnode->AsParseNodeCase(), context);

        //PTNODE(knopTryFinally,"try-finally",None,TryFinally,fnopCleanup)
        case knopTryFinally:
            return WalkTryFinally(pnode->AsParseNodeTryFinally(), context);

       case knopFinally:
           return WalkFinally(pnode->AsParseNodeFinally(), context);

        //PTNODE(knopCatch      , "catch"     ,None    ,Catch,fnopNone)
        case knopCatch:
            return WalkCatch(pnode->AsParseNodeCatch(), context);

        //PTNODE(knopTryCatch      , "try-catch" ,None    ,TryCatch  ,fnopCleanup)
        case knopTryCatch:
            return WalkTryCatch(pnode->AsParseNodeTryCatch(), context);

        //PTNODE(knopTry        , "try"       ,None    ,Try  ,fnopCleanup)
        case knopTry:
            return WalkTry(pnode->AsParseNodeTry(), context);

        //PTNODE(knopThrow      , "throw"     ,None    ,Uni  ,fnopNone)
        case knopThrow:
            return WalkPostUnary(pnode->AsParseNodeUni(), context);

        case knopStrTemplate:
            return WalkStringTemplate(pnode->AsParseNodeStrTemplate(), context);

        //PTNODE(knopClassDecl  , "classDecl" ,None    ,Class       ,fnopLeaf)
        case knopClassDecl:
            return WalkClass(pnode->AsParseNodeClass(), context);

        case knopExportDefault:
            return Walk(pnode->AsParseNodeExportDefault()->pnodeExpr, context);

        default:
        {
            uint fnop = ParseNode::Grfnop(pnode->nop);

            if (fnop & fnopLeaf || fnop & fnopNone)
            {
                return WalkLeaf(pnode, context);
            }
            else if (fnop & fnopBin)
            {
                return WalkBinary(pnode->AsParseNodeBin(), context);
            }
            else if (fnop & fnopUni)
            {
                // Prefix unary operators.
                return WalkPreUnary(pnode->AsParseNodeUni(), context);
            }

            // Some node types are both fnopNotExprStmt and something else. Try the above cases first and fall back to this one.
            if (fnop & fnopNotExprStmt)
            {
                return WalkLeaf(pnode, context);
            }

            Assert(false);
            __assume(false);
        }
        }
    }